

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_functions.cpp
# Opt level: O3

unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
duckdb::DefaultFunctionGenerator::CreateInternalMacroInfo
          (array_ptr<const_duckdb::DefaultMacro,_true> macros)

{
  char *pcVar1;
  char *pcVar2;
  ParserOptions options;
  ParserOptions options_00;
  CreateMacroInfo *this;
  DefaultMacro *pDVar3;
  reference pvVar4;
  ScalarMacroFunction *this_00;
  pointer pSVar5;
  ColumnRefExpression *this_01;
  pointer pCVar6;
  InternalException *this_02;
  pointer in_RDX;
  DefaultMacro *in_RSI;
  CreateMacroInfo *in_RDI;
  char **ppcVar7;
  DefaultNamedParameter *pDVar8;
  array_ptr_iterator<const_duckdb::DefaultMacro> __begin1;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expr_list;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expressions;
  allocator local_f9;
  _Head_base<0UL,_duckdb::CreateMacroInfo_*,_false> local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [32];
  array_ptr_iterator<const_duckdb::DefaultMacro> local_c0;
  __node_base local_a8;
  size_type local_a0;
  DefaultMacro *local_90;
  __node_base_ptr local_88;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Stack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  array_ptr<const_duckdb::DefaultMacro,_true> local_58;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_48;
  
  this = (CreateMacroInfo *)operator_new(0x198);
  CreateMacroInfo::CreateMacroInfo(this,MACRO_ENTRY);
  (in_RDI->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)this;
  local_c0.index = 0;
  local_f8._M_head_impl = in_RDI;
  if (in_RDX != (pointer)0x0) {
    local_e0._24_8_ = in_RDX;
    local_c0.ptr = in_RSI;
    local_c0.size = (idx_t)in_RDX;
    local_90 = in_RSI;
    do {
      pDVar3 = array_ptr_iterator<const_duckdb::DefaultMacro>::operator*(&local_c0);
      ::std::__cxx11::string::string((string *)local_f0,pDVar3->macro,(allocator *)&local_a8);
      local_70 = 1;
      uStack_68 = 1000;
      local_60 = 0;
      options.max_expression_depth = 1000;
      options.preserve_identifier_case = true;
      options.integer_division = false;
      options._2_6_ = 0;
      options.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
      Parser::ParseExpressionList
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&local_48,(string *)local_f0,options);
      if ((ScalarMacroFunction *)local_f0._0_8_ != (ScalarMacroFunction *)local_e0) {
        operator_delete((void *)local_f0._0_8_);
      }
      pvVar4 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                             *)&local_48,0);
      this_00 = (ScalarMacroFunction *)operator_new(0x68);
      local_f0._0_8_ =
           (pvVar4->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pvVar4->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)0x0;
      ScalarMacroFunction::ScalarMacroFunction
                (this_00,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)local_f0);
      local_e0._16_8_ = this_00;
      if ((ParsedExpression *)local_f0._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_f0._0_8_ + 8))();
      }
      if (pDVar3->parameters[0] != (char *)0x0) {
        ppcVar7 = pDVar3->parameters;
        do {
          ppcVar7 = ppcVar7 + 1;
          pSVar5 = unique_ptr<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>,_true>
                   ::operator->((unique_ptr<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>,_true>
                                 *)(local_e0 + 0x10));
          this_01 = (ColumnRefExpression *)operator_new(0x50);
          ::std::__cxx11::string::string((string *)local_f0,ppcVar7[-1],&local_f9);
          ColumnRefExpression::ColumnRefExpression(this_01,(string *)local_f0);
          if ((ParsedExpression *)local_f0._0_8_ != (ParsedExpression *)local_e0) {
            operator_delete((void *)local_f0._0_8_);
          }
          local_a8._M_nxt = (_Hash_node_base *)this_01;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&(pSVar5->super_MacroFunction).parameters,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_a8);
          if ((ColumnRefExpression *)local_a8._M_nxt != (ColumnRefExpression *)0x0) {
            (*(((ParsedExpression *)&(local_a8._M_nxt)->_M_nxt)->super_BaseExpression).
              _vptr_BaseExpression[1])();
          }
        } while (*ppcVar7 != (char *)0x0);
      }
      if (pDVar3->named_parameters[0].name != (char *)0x0) {
        pDVar8 = pDVar3->named_parameters;
        do {
          pDVar8 = pDVar8 + 1;
          ::std::__cxx11::string::string((string *)local_f0,pDVar8[-1].default_value,&local_f9);
          local_88 = (__node_base_ptr)&DAT_00000001;
          _Stack_80._M_head_impl = (ParsedExpression *)0x3e8;
          local_78 = 0;
          options_00.max_expression_depth = 1000;
          options_00.preserve_identifier_case = true;
          options_00.integer_division = false;
          options_00._2_6_ = 0;
          options_00.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
          Parser::ParseExpressionList
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      *)&local_a8,(string *)local_f0,options_00);
          if ((ParsedExpression *)local_f0._0_8_ != (ParsedExpression *)local_e0) {
            operator_delete((void *)local_f0._0_8_);
          }
          if (local_a0 - (long)local_a8._M_nxt != 8) {
            this_02 = (InternalException *)__cxa_allocate_exception(0x10);
            local_f0._0_8_ = local_e0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"Expected a single expression","");
            InternalException::InternalException(this_02,(string *)local_f0);
            __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pSVar5 = unique_ptr<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>,_true>
                   ::operator->((unique_ptr<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>,_true>
                                 *)(local_e0 + 0x10));
          pvVar4 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                 *)&local_a8,0);
          local_f0._0_8_ = pDVar8[-1].name;
          local_f0._8_8_ =
               (pvVar4->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pvVar4->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<char_const*,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&(pSVar5->super_MacroFunction).default_parameters,(string *)local_f0);
          if ((ParsedExpression *)local_f0._8_8_ != (ParsedExpression *)0x0) {
            (**(code **)((long)((BaseExpression *)local_f0._8_8_)->_vptr_BaseExpression + 8))();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)&local_a8);
        } while (pDVar8->name != (char *)0x0);
      }
      pCVar6 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                             *)local_f8._M_head_impl);
      local_f0._0_8_ = local_e0._16_8_;
      local_e0._16_8_ =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
           0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>
                ((vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>>
                  *)&pCVar6->macros,
                 (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                  *)local_f0);
      if ((ScalarMacroFunction *)local_f0._0_8_ != (ScalarMacroFunction *)0x0) {
        (**(code **)(*(long *)local_f0._0_8_ + 8))();
      }
      if ((pointer)local_e0._16_8_ != (pointer)0x0) {
        (**(code **)((long)*(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                             *)local_e0._16_8_ + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_48);
      local_c0.index = local_c0.index + 1;
      if (local_c0.size <= local_c0.index) {
        local_c0.index = local_c0.size;
      }
    } while (((local_c0.ptr != local_90) || (local_c0.index != local_e0._24_8_)) ||
            (local_c0.size != local_e0._24_8_));
  }
  pDVar3 = array_ptr<const_duckdb::DefaultMacro,_true>::operator[](&local_58,0);
  pcVar1 = pDVar3->schema;
  pCVar6 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)local_f8._M_head_impl);
  pcVar2 = (char *)(pCVar6->super_CreateFunctionInfo).super_CreateInfo.schema._M_string_length;
  strlen(pcVar1);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(pCVar6->super_CreateFunctionInfo).super_CreateInfo.schema,0,pcVar2,
             (ulong)pcVar1);
  pDVar3 = array_ptr<const_duckdb::DefaultMacro,_true>::operator[](&local_58,0);
  pcVar1 = pDVar3->name;
  pCVar6 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)local_f8._M_head_impl);
  pcVar2 = (char *)(pCVar6->super_CreateFunctionInfo).name._M_string_length;
  strlen(pcVar1);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(pCVar6->super_CreateFunctionInfo).name,0,pcVar2,(ulong)pcVar1);
  pCVar6 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)local_f8._M_head_impl);
  (pCVar6->super_CreateFunctionInfo).super_CreateInfo.temporary = true;
  pCVar6 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)local_f8._M_head_impl);
  (pCVar6->super_CreateFunctionInfo).super_CreateInfo.internal = true;
  return (unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>_>)
         (_Tuple_impl<0UL,_duckdb::CreateMacroInfo_*,_std::default_delete<duckdb::CreateMacroInfo>_>
         )local_f8._M_head_impl;
}

Assistant:

unique_ptr<CreateMacroInfo> DefaultFunctionGenerator::CreateInternalMacroInfo(array_ptr<const DefaultMacro> macros) {
	auto type = CatalogType::MACRO_ENTRY;
	auto bind_info = make_uniq<CreateMacroInfo>(type);
	for(auto &default_macro : macros) {
		// parse the expression
		auto expressions = Parser::ParseExpressionList(default_macro.macro);
		D_ASSERT(expressions.size() == 1);

		auto function = make_uniq<ScalarMacroFunction>(std::move(expressions[0]));
		for (idx_t param_idx = 0; default_macro.parameters[param_idx] != nullptr; param_idx++) {
			function->parameters.push_back(
			    make_uniq<ColumnRefExpression>(default_macro.parameters[param_idx]));
		}
		for (idx_t named_idx = 0; default_macro.named_parameters[named_idx].name != nullptr; named_idx++) {
			auto expr_list = Parser::ParseExpressionList(default_macro.named_parameters[named_idx].default_value);
			if (expr_list.size() != 1) {
				throw InternalException("Expected a single expression");
			}
			function->default_parameters.insert(
				make_pair(default_macro.named_parameters[named_idx].name, std::move(expr_list[0])));
		}
		D_ASSERT(function->type == MacroType::SCALAR_MACRO);
		bind_info->macros.push_back(std::move(function));
	}
	bind_info->schema = macros[0].schema;
	bind_info->name = macros[0].name;
	bind_info->temporary = true;
	bind_info->internal = true;
	return bind_info;
}